

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkPipelineRenderingCreateInfoKHR *
Diligent::GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo
          (VkPipelineRenderingCreateInfoKHR *__return_storage_ptr__,
          GraphicsPipelineDesc *PipelineDesc,
          vector<VkFormat,_std::allocator<VkFormat>_> *ColorAttachmentFormats)

{
  byte bVar1;
  TEXTURE_FORMAT TexFmt;
  VkFormat VVar2;
  TextureFormatAttribs *pTVar3;
  Uint32 rt;
  ulong uVar4;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->viewMask = 0;
  __return_storage_ptr__->colorAttachmentCount = 0;
  __return_storage_ptr__->pColorAttachmentFormats = (VkFormat *)0x0;
  __return_storage_ptr__->depthAttachmentFormat = VK_FORMAT_UNDEFINED;
  __return_storage_ptr__->stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO;
  __return_storage_ptr__->viewMask = 0;
  bVar1 = PipelineDesc->NumRenderTargets;
  __return_storage_ptr__->colorAttachmentCount = (uint)bVar1;
  std::vector<VkFormat,_std::allocator<VkFormat>_>::resize(ColorAttachmentFormats,(ulong)bVar1);
  for (uVar4 = 0; uVar4 < PipelineDesc->NumRenderTargets; uVar4 = uVar4 + 1) {
    VVar2 = TexFormatToVkFormat(PipelineDesc->RTVFormats[uVar4]);
    (ColorAttachmentFormats->super__Vector_base<VkFormat,_std::allocator<VkFormat>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4] = VVar2;
  }
  __return_storage_ptr__->pColorAttachmentFormats =
       (ColorAttachmentFormats->super__Vector_base<VkFormat,_std::allocator<VkFormat>_>)._M_impl.
       super__Vector_impl_data._M_start;
  TexFmt = PipelineDesc->DSVFormat;
  if (TexFmt != TEX_FORMAT_UNKNOWN) {
    VVar2 = TexFormatToVkFormat(TexFmt);
    __return_storage_ptr__->depthAttachmentFormat = VVar2;
    pTVar3 = GetTextureFormatAttribs(TexFmt);
    if (pTVar3->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
      __return_storage_ptr__->stencilAttachmentFormat = VVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

VkPipelineRenderingCreateInfoKHR GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo(const GraphicsPipelineDesc& PipelineDesc,
                                                                                       std::vector<VkFormat>&      ColorAttachmentFormats)
{
    VkPipelineRenderingCreateInfoKHR PipelineRenderingCI{};
    PipelineRenderingCI.sType    = VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR;
    PipelineRenderingCI.pNext    = nullptr;
    PipelineRenderingCI.viewMask = 0;

    PipelineRenderingCI.colorAttachmentCount = PipelineDesc.NumRenderTargets;
    ColorAttachmentFormats.resize(PipelineDesc.NumRenderTargets);
    for (Uint32 rt = 0; rt < PipelineDesc.NumRenderTargets; ++rt)
    {
        TEXTURE_FORMAT RTVFormat   = PipelineDesc.RTVFormats[rt];
        ColorAttachmentFormats[rt] = TexFormatToVkFormat(RTVFormat);
    }
    PipelineRenderingCI.pColorAttachmentFormats = ColorAttachmentFormats.data();

    TEXTURE_FORMAT DSVFormat = PipelineDesc.DSVFormat;
    if (DSVFormat != TEX_FORMAT_UNKNOWN)
    {
        PipelineRenderingCI.depthAttachmentFormat = TexFormatToVkFormat(DSVFormat);
        const TextureFormatAttribs& FmtAttribs    = GetTextureFormatAttribs(DSVFormat);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            PipelineRenderingCI.stencilAttachmentFormat = PipelineRenderingCI.depthAttachmentFormat;
        }
    }

    return PipelineRenderingCI;
}